

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChInertiaUtils.h
# Opt level: O2

void chrono::ChInertiaUtils::PrincipalInertia
               (ChMatrix33<double> *inertia,ChVector<double> *principal_inertia,
               ChMatrix33<double> *principal_axes)

{
  Scalar SVar1;
  ChVectorN<double,_3> principal_I;
  ChVectorN<double,_3> local_78;
  Scalar local_58;
  BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true> local_50;
  
  ChMatrix33<double>::SelfAdjointEigenSolve(inertia,principal_axes,&local_78);
  SVar1 = Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3>::run
                    (&principal_axes->super_Matrix<double,_3,_3,_1,_3,_3>);
  if (SVar1 < 0.0) {
    local_58 = -1.0;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true>::
    BlockImpl_dense(&local_50,&principal_axes->super_Matrix<double,_3,_3,_1,_3,_3>,0);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false>_>::operator*=
              ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false>_> *)
               &local_50,&local_58);
  }
  principal_inertia->m_data[0] =
       local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [0];
  principal_inertia->m_data[1] =
       local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [1];
  principal_inertia->m_data[2] =
       local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2];
  return;
}

Assistant:

static void PrincipalInertia(const ChMatrix33<>& inertia,
                                 ChVector<>& principal_inertia,
                                 ChMatrix33<>& principal_axes) {
        ChVectorN<double, 3> principal_I;
        inertia.SelfAdjointEigenSolve(principal_axes, principal_I);

        // Ensure the principal_axes represent a proper rotation matrix.
        // If the determinant is -1, flip the sign of one of the eigenvectors to obtain a proper rotation
        // (i.e. a transformation representing a right-handed rotation)
        if (principal_axes.determinant() < 0) {
            principal_axes.col(0) *= -1;
        }

        // Return the principal moments of inertia in a ChVector
        principal_inertia = principal_I;

        // Tests
        ////std::cout << "Input inertia matrix: J\n" << inertia << std::endl;
        ////std::cout << "Principal moments of inertia: I\n" << principal_I << std::endl;
        ////std::cout << "Principal axes: R\n" << principal_axes << std::endl;
        ////std::cout << "det(R) = " << principal_axes.determinant() << std::endl;
        ////std::cout << "Transform back: R * diag(I) * R'\n"
        ////          << principal_axes * ChMatrix33<>(principal_inertia) * principal_axes.transpose() << std::endl;
    }